

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

bool __thiscall
Chainstate::ConnectBlock
          (Chainstate *this,CBlock *block,BlockValidationState *state,CBlockIndex *pindex,
          CCoinsViewCache *view,bool fJustCheck)

{
  bool *pbVar1;
  int64_t *piVar2;
  duration *pdVar3;
  int iVar4;
  long lVar5;
  uint256 *puVar6;
  pointer ptVar7;
  pointer ptVar8;
  CChainParams *consensusParams;
  Notifications *pNVar9;
  ChainstateManager *pCVar10;
  BlockManager *pBVar11;
  pointer psVar12;
  element_type *peVar13;
  CTransaction *this_00;
  pointer pCVar14;
  pointer pCVar15;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uchar *puVar18;
  bool bVar19;
  bool bVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  optional<uint256> *poVar24;
  uchar *puVar25;
  __node_base_ptr p_Var26;
  CBlockIndex *pCVar27;
  optional<arith_uint256> *b;
  int64_t iVar28;
  long lVar29;
  Logger *pLVar30;
  undefined7 extraout_var;
  long lVar31;
  pointer psVar32;
  Coin *pCVar33;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  long lVar34;
  long lVar35;
  CAmount CVar36;
  pointer pcVar37;
  string *txundo;
  _Hash_node_base *p_Var38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar39;
  int iVar40;
  CCheckQueue<CScriptCheck> *pqueueIn;
  vector<CScriptCheck,_std::allocator<CScriptCheck>_> *pvChecks;
  pointer pCVar41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  undefined7 in_register_00000089;
  char *args_2;
  ulong uVar42;
  long in_FS_OFFSET;
  bool bVar43;
  double dVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  _Alloc_hider _Var48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view logging_function_07;
  string_view logging_function_08;
  string_view logging_function_09;
  string_view logging_function_10;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  string_view source_file_08;
  string_view source_file_09;
  string_view source_file_10;
  string_view source_file_11;
  string_view source_file_12;
  string_view source_file_13;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view logging_function_11;
  string_view logging_function_12;
  string_view logging_function_13;
  double *pdVar55;
  Level in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  uint uVar56;
  undefined4 in_stack_fffffffffffffd54;
  undefined7 in_stack_fffffffffffffd58;
  char cVar57;
  long local_280;
  ulong local_268;
  double local_230;
  undefined4 local_224;
  CAmount txfee;
  vector<int,_std::allocator<int>_> prevheights;
  vector<PrecomputedTransactionData,_std::allocator<PrecomputedTransactionData>_> txsdata;
  CBlockUndo blockundo;
  CBlockIndex *pindex_local;
  CCheckQueueControl<CScriptCheck> control;
  string local_1a8;
  string local_188;
  string log_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined1 local_108 [16];
  uint256 block_hash;
  string local_d8;
  double local_b8 [4];
  vector<CScriptCheck,_std::allocator<CScriptCheck>_> vChecks;
  CAmount blockReward;
  char *pcStack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  string log_msg_1;
  
  args_2 = (char *)CONCAT71(in_register_00000089,fJustCheck);
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  pindex_local = pindex;
  if (pindex == (CBlockIndex *)0x0) {
    __assert_fail("pindex",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                  ,0x96a,
                  "bool Chainstate::ConnectBlock(const CBlock &, BlockValidationState &, CBlockIndex *, CCoinsViewCache &, bool)"
                 );
  }
  CBlockHeader::GetHash(&block_hash,&block->super_CBlockHeader);
  puVar6 = pindex_local->phashBlock;
  auVar50[0] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0] ==
                (puVar6->super_base_blob<256U>).m_data._M_elems[0]);
  auVar50[1] = -(block_hash.super_base_blob<256U>.m_data._M_elems[1] ==
                (puVar6->super_base_blob<256U>).m_data._M_elems[1]);
  auVar50[2] = -(block_hash.super_base_blob<256U>.m_data._M_elems[2] ==
                (puVar6->super_base_blob<256U>).m_data._M_elems[2]);
  auVar50[3] = -(block_hash.super_base_blob<256U>.m_data._M_elems[3] ==
                (puVar6->super_base_blob<256U>).m_data._M_elems[3]);
  auVar50[4] = -(block_hash.super_base_blob<256U>.m_data._M_elems[4] ==
                (puVar6->super_base_blob<256U>).m_data._M_elems[4]);
  auVar50[5] = -(block_hash.super_base_blob<256U>.m_data._M_elems[5] ==
                (puVar6->super_base_blob<256U>).m_data._M_elems[5]);
  auVar50[6] = -(block_hash.super_base_blob<256U>.m_data._M_elems[6] ==
                (puVar6->super_base_blob<256U>).m_data._M_elems[6]);
  auVar50[7] = -(block_hash.super_base_blob<256U>.m_data._M_elems[7] ==
                (puVar6->super_base_blob<256U>).m_data._M_elems[7]);
  auVar50[8] = -(block_hash.super_base_blob<256U>.m_data._M_elems[8] ==
                (puVar6->super_base_blob<256U>).m_data._M_elems[8]);
  auVar50[9] = -(block_hash.super_base_blob<256U>.m_data._M_elems[9] ==
                (puVar6->super_base_blob<256U>).m_data._M_elems[9]);
  auVar50[10] = -(block_hash.super_base_blob<256U>.m_data._M_elems[10] ==
                 (puVar6->super_base_blob<256U>).m_data._M_elems[10]);
  auVar50[0xb] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0xb] ==
                  (puVar6->super_base_blob<256U>).m_data._M_elems[0xb]);
  auVar50[0xc] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0xc] ==
                  (puVar6->super_base_blob<256U>).m_data._M_elems[0xc]);
  auVar50[0xd] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0xd] ==
                  (puVar6->super_base_blob<256U>).m_data._M_elems[0xd]);
  auVar50[0xe] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0xe] ==
                  (puVar6->super_base_blob<256U>).m_data._M_elems[0xe]);
  auVar50[0xf] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0xf] ==
                  (puVar6->super_base_blob<256U>).m_data._M_elems[0xf]);
  auVar45[0] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0x10] ==
                (puVar6->super_base_blob<256U>).m_data._M_elems[0x10]);
  auVar45[1] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0x11] ==
                (puVar6->super_base_blob<256U>).m_data._M_elems[0x11]);
  auVar45[2] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0x12] ==
                (puVar6->super_base_blob<256U>).m_data._M_elems[0x12]);
  auVar45[3] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0x13] ==
                (puVar6->super_base_blob<256U>).m_data._M_elems[0x13]);
  auVar45[4] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0x14] ==
                (puVar6->super_base_blob<256U>).m_data._M_elems[0x14]);
  auVar45[5] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0x15] ==
                (puVar6->super_base_blob<256U>).m_data._M_elems[0x15]);
  auVar45[6] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0x16] ==
                (puVar6->super_base_blob<256U>).m_data._M_elems[0x16]);
  auVar45[7] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0x17] ==
                (puVar6->super_base_blob<256U>).m_data._M_elems[0x17]);
  auVar45[8] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0x18] ==
                (puVar6->super_base_blob<256U>).m_data._M_elems[0x18]);
  auVar45[9] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0x19] ==
                (puVar6->super_base_blob<256U>).m_data._M_elems[0x19]);
  auVar45[10] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                 (puVar6->super_base_blob<256U>).m_data._M_elems[0x1a]);
  auVar45[0xb] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                  (puVar6->super_base_blob<256U>).m_data._M_elems[0x1b]);
  auVar45[0xc] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                  (puVar6->super_base_blob<256U>).m_data._M_elems[0x1c]);
  auVar45[0xd] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                  (puVar6->super_base_blob<256U>).m_data._M_elems[0x1d]);
  auVar45[0xe] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                  (puVar6->super_base_blob<256U>).m_data._M_elems[0x1e]);
  auVar45[0xf] = -(block_hash.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                  (puVar6->super_base_blob<256U>).m_data._M_elems[0x1f]);
  auVar45 = auVar45 & auVar50;
  if ((ushort)((ushort)(SUB161(auVar45 >> 7,0) & 1) | (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar45 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar45 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar45 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar45[0xf] >> 7) << 0xf) != 0xffff) {
    __assert_fail("*pindex->phashBlock == block_hash",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                  ,0x96d,
                  "bool Chainstate::ConnectBlock(const CBlock &, BlockValidationState &, CBlockIndex *, CCoinsViewCache &, bool)"
                 );
  }
  ptVar7 = (this->m_chainman->m_script_check_queue).m_worker_threads.
           super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
  ptVar8 = (this->m_chainman->m_script_check_queue).m_worker_threads.
           super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar23 = std::chrono::_V2::steady_clock::now();
  consensusParams = (this->m_chainman->m_options).chainparams;
  bVar19 = !fJustCheck;
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)bVar19;
  bVar19 = CheckBlock(block,state,&consensusParams->consensus,bVar19,bVar19);
  if (!bVar19) {
    if ((state->super_ValidationState<BlockValidationResult>).m_result == BLOCK_MUTATED) {
      pNVar9 = (this->m_chainman->m_options).notifications;
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&log_msg,"Corrupt block found indicating potential hardware failure.","")
      ;
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_148,"Corrupt block found indicating potential hardware failure."
                   ,"");
      }
      else {
        log_msg_1._M_dataplus._M_p = "Corrupt block found indicating potential hardware failure.";
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  (&local_148,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&log_msg_1);
      }
      (*pNVar9->_vptr_Notifications[8])(pNVar9,&log_msg);
      if ((state->super_ValidationState<BlockValidationResult>).m_mode == M_VALID) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&(state->super_ValidationState<BlockValidationResult>).m_reject_reason,&log_msg);
      }
      (state->super_ValidationState<BlockValidationResult>).m_mode = M_ERROR;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      local_d8.field_2._M_allocated_capacity = log_msg.field_2._M_allocated_capacity;
      _Var48._M_p = log_msg._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)log_msg._M_dataplus._M_p != &log_msg.field_2) {
LAB_00402521:
        operator_delete(_Var48._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                (&local_d8,&state->super_ValidationState<BlockValidationResult>);
      pLVar30 = LogInstance();
      bVar19 = BCLog::Logger::Enabled(pLVar30);
      if (bVar19) {
        log_msg._M_string_length = 0;
        log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
        log_msg.field_2._M_allocated_capacity =
             log_msg.field_2._M_allocated_capacity & 0xffffffffffffff00;
        tinyformat::format<char[13],std::__cxx11::string>
                  (&log_msg_1,(tinyformat *)"%s: Consensus::CheckBlock: %s\n","ConnectBlock",
                   (char (*) [13])&local_d8,args_1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&log_msg,&log_msg_1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)log_msg_1._M_dataplus._M_p != &log_msg_1.field_2) {
          operator_delete(log_msg_1._M_dataplus._M_p,
                          CONCAT71(log_msg_1.field_2._M_allocated_capacity._1_7_,
                                   log_msg_1.field_2._M_local_buf[0]) + 1);
        }
        pLVar30 = LogInstance();
        log_msg_1._M_dataplus._M_p = (pointer)0x57;
        log_msg_1._M_string_length = (size_type)anon_var_dwarf_128d5d9;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
        ;
        source_file_00._M_len = 0x57;
        str_00._M_str = log_msg._M_dataplus._M_p;
        str_00._M_len = log_msg._M_string_length;
        logging_function_12._M_str = "ConnectBlock";
        logging_function_12._M_len = 0xc;
        BCLog::Logger::LogPrintStr
                  (pLVar30,str_00,logging_function_12,source_file_00,0x987,ALL,Error);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)log_msg._M_dataplus._M_p != &log_msg.field_2) {
          operator_delete(log_msg._M_dataplus._M_p,log_msg.field_2._M_allocated_capacity + 1);
        }
      }
      _Var48._M_p = local_d8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) goto LAB_00402521;
    }
    uVar23 = 0;
    goto LAB_00403e51;
  }
  if (pindex_local->pprev == (CBlockIndex *)0x0) {
    local_118 = 0;
    uStack_110 = 0;
    local_108 = (undefined1  [16])0x0;
  }
  else {
    puVar6 = pindex_local->pprev->phashBlock;
    if (puVar6 == (uint256 *)0x0) goto LAB_00404143;
    local_118 = *(undefined8 *)(puVar6->super_base_blob<256U>).m_data._M_elems;
    uStack_110 = *(undefined8 *)((puVar6->super_base_blob<256U>).m_data._M_elems + 8);
    local_108 = *(undefined1 (*) [16])((puVar6->super_base_blob<256U>).m_data._M_elems + 0x10);
  }
  (*(view->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[2])(&log_msg);
  auVar49[0] = -(log_msg.field_2._M_local_buf[0] == local_108[0]);
  auVar49[1] = -(log_msg.field_2._M_local_buf[1] == local_108[1]);
  auVar49[2] = -(log_msg.field_2._M_local_buf[2] == local_108[2]);
  auVar49[3] = -(log_msg.field_2._M_local_buf[3] == local_108[3]);
  auVar49[4] = -(log_msg.field_2._M_local_buf[4] == local_108[4]);
  auVar49[5] = -(log_msg.field_2._M_local_buf[5] == local_108[5]);
  auVar49[6] = -(log_msg.field_2._M_local_buf[6] == local_108[6]);
  auVar49[7] = -(log_msg.field_2._M_local_buf[7] == local_108[7]);
  auVar49[8] = -(log_msg.field_2._M_local_buf[8] == local_108[8]);
  auVar49[9] = -(log_msg.field_2._M_local_buf[9] == local_108[9]);
  auVar49[10] = -(log_msg.field_2._M_local_buf[10] == local_108[10]);
  auVar49[0xb] = -(log_msg.field_2._M_local_buf[0xb] == local_108[0xb]);
  auVar49[0xc] = -(log_msg.field_2._M_local_buf[0xc] == local_108[0xc]);
  auVar49[0xd] = -(log_msg.field_2._M_local_buf[0xd] == local_108[0xd]);
  auVar49[0xe] = -(log_msg.field_2._M_local_buf[0xe] == local_108[0xe]);
  auVar49[0xf] = -(log_msg.field_2._M_local_buf[0xf] == local_108[0xf]);
  auVar46[0] = -((char)log_msg._M_dataplus._M_p == (char)local_118);
  auVar46[1] = -(log_msg._M_dataplus._M_p._1_1_ == local_118._1_1_);
  auVar46[2] = -(log_msg._M_dataplus._M_p._2_1_ == local_118._2_1_);
  auVar46[3] = -(log_msg._M_dataplus._M_p._3_1_ == local_118._3_1_);
  auVar46[4] = -(log_msg._M_dataplus._M_p._4_1_ == local_118._4_1_);
  auVar46[5] = -(log_msg._M_dataplus._M_p._5_1_ == local_118._5_1_);
  auVar46[6] = -(log_msg._M_dataplus._M_p._6_1_ == local_118._6_1_);
  auVar46[7] = -(log_msg._M_dataplus._M_p._7_1_ == local_118._7_1_);
  auVar46[8] = -((char)log_msg._M_string_length == (char)uStack_110);
  auVar46[9] = -(log_msg._M_string_length._1_1_ == uStack_110._1_1_);
  auVar46[10] = -(log_msg._M_string_length._2_1_ == uStack_110._2_1_);
  auVar46[0xb] = -(log_msg._M_string_length._3_1_ == uStack_110._3_1_);
  auVar46[0xc] = -(log_msg._M_string_length._4_1_ == uStack_110._4_1_);
  auVar46[0xd] = -(log_msg._M_string_length._5_1_ == uStack_110._5_1_);
  auVar46[0xe] = -(log_msg._M_string_length._6_1_ == uStack_110._6_1_);
  auVar46[0xf] = -(log_msg._M_string_length._7_1_ == uStack_110._7_1_);
  auVar46 = auVar46 & auVar49;
  if ((ushort)((ushort)(SUB161(auVar46 >> 7,0) & 1) | (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar46 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar46 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar46[0xf] >> 7) << 0xf) != 0xffff) {
    __assert_fail("hashPrevBlock == view.GetBestBlock()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                  ,0x98d,
                  "bool Chainstate::ConnectBlock(const CBlock &, BlockValidationState &, CBlockIndex *, CCoinsViewCache &, bool)"
                 );
  }
  pCVar10 = this->m_chainman;
  piVar2 = &pCVar10->num_blocks_total;
  *piVar2 = *piVar2 + 1;
  auVar51[0] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [0] == block_hash.super_base_blob<256U>.m_data._M_elems[0]);
  auVar51[1] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [1] == block_hash.super_base_blob<256U>.m_data._M_elems[1]);
  auVar51[2] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [2] == block_hash.super_base_blob<256U>.m_data._M_elems[2]);
  auVar51[3] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [3] == block_hash.super_base_blob<256U>.m_data._M_elems[3]);
  auVar51[4] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [4] == block_hash.super_base_blob<256U>.m_data._M_elems[4]);
  auVar51[5] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [5] == block_hash.super_base_blob<256U>.m_data._M_elems[5]);
  auVar51[6] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [6] == block_hash.super_base_blob<256U>.m_data._M_elems[6]);
  auVar51[7] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [7] == block_hash.super_base_blob<256U>.m_data._M_elems[7]);
  auVar51[8] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [8] == block_hash.super_base_blob<256U>.m_data._M_elems[8]);
  auVar51[9] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [9] == block_hash.super_base_blob<256U>.m_data._M_elems[9]);
  auVar51[10] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                  _M_elems[10] == block_hash.super_base_blob<256U>.m_data._M_elems[10]);
  auVar51[0xb] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                   _M_elems[0xb] == block_hash.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar51[0xc] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                   _M_elems[0xc] == block_hash.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar51[0xd] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                   _M_elems[0xd] == block_hash.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar51[0xe] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                   _M_elems[0xe] == block_hash.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar51[0xf] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                   _M_elems[0xf] == block_hash.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar47[0] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [0x10] == block_hash.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar47[1] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [0x11] == block_hash.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar47[2] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [0x12] == block_hash.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar47[3] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [0x13] == block_hash.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar47[4] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [0x14] == block_hash.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar47[5] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [0x15] == block_hash.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar47[6] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [0x16] == block_hash.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar47[7] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [0x17] == block_hash.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar47[8] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [0x18] == block_hash.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar47[9] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                 [0x19] == block_hash.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar47[10] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                  _M_elems[0x1a] == block_hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar47[0xb] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                   _M_elems[0x1b] == block_hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar47[0xc] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                   _M_elems[0x1c] == block_hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar47[0xd] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                   _M_elems[0x1d] == block_hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar47[0xe] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                   _M_elems[0x1e] == block_hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar47[0xf] = -((consensusParams->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                   _M_elems[0x1f] == block_hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar47 = auVar47 & auVar51;
  if ((ushort)((ushort)(SUB161(auVar47 >> 7,0) & 1) | (ushort)(SUB161(auVar47 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar47 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar47 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar47 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar47 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar47 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar47 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar47 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar47 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar47 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar47 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar47 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar47[0xf] >> 7) << 0xf) == 0xffff) {
    uVar23 = 1;
    if (!fJustCheck) {
      puVar6 = pindex_local->phashBlock;
      if (puVar6 != (uint256 *)0x0) {
        log_msg._0_16_ = *(undefined1 (*) [16])(puVar6->super_base_blob<256U>).m_data._M_elems;
        log_msg.field_2._M_allocated_capacity =
             *(undefined8 *)((puVar6->super_base_blob<256U>).m_data._M_elems + 0x10);
        log_msg.field_2._8_8_ =
             *(undefined8 *)((puVar6->super_base_blob<256U>).m_data._M_elems + 0x18);
        CCoinsViewCache::SetBestBlock(view,(uint256 *)&log_msg);
        goto LAB_00403e51;
      }
      goto LAB_00404143;
    }
    goto LAB_00403e51;
  }
  poVar24 = inline_assertion_check<true,std::optional<uint256>const&>
                      (&(pCVar10->m_options).assumed_valid_block,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.h"
                       ,0x3da,"AssumedValidBlock","m_options.assumed_valid_block");
  pbVar1 = &(poVar24->super__Optional_base<uint256,_true,_true>)._M_payload.
            super__Optional_payload_base<uint256>._M_engaged;
  puVar25 = std::
            __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                      (poVar24,pbVar1);
  cVar57 = '\x01';
  if ((bool *)puVar25 != pbVar1) {
    pBVar11 = this->m_blockman;
    poVar24 = inline_assertion_check<true,std::optional<uint256>const&>
                        (&(this->m_chainman->m_options).assumed_valid_block,
                         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.h"
                         ,0x3da,"AssumedValidBlock","m_options.assumed_valid_block");
    uVar42 = *(ulong *)&(poVar24->super__Optional_base<uint256,_true,_true>)._M_payload.
                        super__Optional_payload_base<uint256>._M_payload;
    p_Var38 = (_Hash_node_base *)0x0;
    p_Var26 = std::
              _Hashtable<uint256,_std::pair<const_uint256,_CBlockIndex>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_BlockHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::_M_find_before_node
                        (&(pBVar11->m_block_index)._M_h,
                         uVar42 % (pBVar11->m_block_index)._M_h._M_bucket_count,(key_type *)poVar24,
                         uVar42);
    if (p_Var26 != (__node_base_ptr)0x0) {
      p_Var38 = p_Var26->_M_nxt;
    }
    if (((p_Var38 != (_Hash_node_base *)0x0) &&
        (pCVar27 = CBlockIndex::GetAncestor((CBlockIndex *)(p_Var38 + 5),pindex_local->nHeight),
        pCVar27 == pindex_local)) &&
       (pCVar27 = CBlockIndex::GetAncestor(this->m_chainman->m_best_header,pindex_local->nHeight),
       pCVar27 == pindex_local)) {
      pCVar27 = this->m_chainman->m_best_header;
      b = inline_assertion_check<true,std::optional<arith_uint256>const&>
                    (&(this->m_chainman->m_options).minimum_chain_work,
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.h"
                     ,0x3d9,"MinimumChainWork","m_options.minimum_chain_work");
      iVar21 = base_uint<256U>::CompareTo
                         (&(pCVar27->nChainWork).super_base_uint<256U>,(base_uint<256U> *)b);
      if (-1 < iVar21) {
        pCVar27 = this->m_chainman->m_best_header;
        iVar28 = GetBlockProofEquivalentTime
                           (pCVar27,pindex_local,pCVar27,&consensusParams->consensus);
        cVar57 = iVar28 < 0x127501;
      }
    }
  }
  lVar29 = std::chrono::_V2::steady_clock::now();
  pdVar3 = &this->m_chainman->time_check;
  pdVar3->__r = pdVar3->__r + (lVar29 - uVar23);
  pLVar30 = LogInstance();
  pdVar55 = (double *)0x402565;
  bVar19 = BCLog::Logger::WillLogCategoryLevel(pLVar30,BENCH,Debug);
  if (bVar19) {
    log_msg._M_dataplus._M_p = (pointer)((double)(long)(lVar29 - uVar23) / 1000000.0);
    dVar44 = (double)(this->m_chainman->time_check).__r;
    log_msg_1._M_dataplus._M_p = (pointer)(dVar44 / 1000000000.0);
    blockReward = (CAmount)((dVar44 / 1000000.0) / (double)this->m_chainman->num_blocks_total);
    args_2 = "    - Sanity checks: %.2fms [%.2fs (%.2fms/blk)]\n";
    logging_function._M_str = "ConnectBlock";
    logging_function._M_len = 0xc;
    source_file_02._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
    source_file_02._M_len = 0x57;
    LogPrintf_<double,double,double>
              (logging_function,source_file_02,0x9bd,
               IPC|COINDB|PROXY|RAND|CMPCTBLOCK|RPC|ZMQ|BENCH|HTTP|MEMPOOL,(Level)&log_msg,
               (char *)&log_msg_1,(double *)&blockReward,pdVar55,
               (double *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  }
  bVar19 = IsBIP30Repeat(pindex_local);
  if (pindex_local->pprev == (CBlockIndex *)0x0) {
    __assert_fail("pindex->pprev",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                  ,0xa02,
                  "bool Chainstate::ConnectBlock(const CBlock &, BlockValidationState &, CBlockIndex *, CCoinsViewCache &, bool)"
                 );
  }
  pCVar27 = CBlockIndex::GetAncestor(pindex_local->pprev,(consensusParams->consensus).BIP34Height);
  if (bVar19) {
LAB_00402644:
    if (0x1e44d5 < pindex_local->nHeight) goto LAB_004026ac;
  }
  else {
    if (pCVar27 != (CBlockIndex *)0x0) {
      puVar6 = pCVar27->phashBlock;
      if (puVar6 == (uint256 *)0x0) goto LAB_00404143;
      log_msg._0_16_ = *(undefined1 (*) [16])(puVar6->super_base_blob<256U>).m_data._M_elems;
      puVar25 = (puVar6->super_base_blob<256U>).m_data._M_elems + 0x10;
      log_msg.field_2._M_allocated_capacity = *(undefined8 *)puVar25;
      puVar18 = (puVar6->super_base_blob<256U>).m_data._M_elems + 0x18;
      log_msg.field_2._8_8_ = *(undefined8 *)puVar18;
      auVar54[0] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                     [0x10] == *puVar25);
      auVar54[1] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                     [0x11] == (puVar6->super_base_blob<256U>).m_data._M_elems[0x11]);
      auVar54[2] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                     [0x12] == (puVar6->super_base_blob<256U>).m_data._M_elems[0x12]);
      auVar54[3] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                     [0x13] == (puVar6->super_base_blob<256U>).m_data._M_elems[0x13]);
      auVar54[4] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                     [0x14] == (puVar6->super_base_blob<256U>).m_data._M_elems[0x14]);
      auVar54[5] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                     [0x15] == (puVar6->super_base_blob<256U>).m_data._M_elems[0x15]);
      auVar54[6] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                     [0x16] == (puVar6->super_base_blob<256U>).m_data._M_elems[0x16]);
      auVar54[7] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                     [0x17] == (puVar6->super_base_blob<256U>).m_data._M_elems[0x17]);
      auVar54[8] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                     [0x18] == *puVar18);
      auVar54[9] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                     [0x19] == (puVar6->super_base_blob<256U>).m_data._M_elems[0x19]);
      auVar54[10] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                      [0x1a] == (puVar6->super_base_blob<256U>).m_data._M_elems[0x1a]);
      auVar54[0xb] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                       [0x1b] == (puVar6->super_base_blob<256U>).m_data._M_elems[0x1b]);
      auVar54[0xc] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                       [0x1c] == (puVar6->super_base_blob<256U>).m_data._M_elems[0x1c]);
      auVar54[0xd] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                       [0x1d] == (puVar6->super_base_blob<256U>).m_data._M_elems[0x1d]);
      auVar54[0xe] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                       [0x1e] == (puVar6->super_base_blob<256U>).m_data._M_elems[0x1e]);
      auVar54[0xf] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                       [0x1f] == (puVar6->super_base_blob<256U>).m_data._M_elems[0x1f]);
      auVar52[0] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems[0]
                    == (puVar6->super_base_blob<256U>).m_data._M_elems[0]);
      auVar52[1] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems[1]
                    == (puVar6->super_base_blob<256U>).m_data._M_elems[1]);
      auVar52[2] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems[2]
                    == (puVar6->super_base_blob<256U>).m_data._M_elems[2]);
      auVar52[3] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems[3]
                    == (puVar6->super_base_blob<256U>).m_data._M_elems[3]);
      auVar52[4] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems[4]
                    == (puVar6->super_base_blob<256U>).m_data._M_elems[4]);
      auVar52[5] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems[5]
                    == (puVar6->super_base_blob<256U>).m_data._M_elems[5]);
      auVar52[6] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems[6]
                    == (puVar6->super_base_blob<256U>).m_data._M_elems[6]);
      auVar52[7] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems[7]
                    == (puVar6->super_base_blob<256U>).m_data._M_elems[7]);
      auVar52[8] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems[8]
                    == (puVar6->super_base_blob<256U>).m_data._M_elems[8]);
      auVar52[9] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems[9]
                    == (puVar6->super_base_blob<256U>).m_data._M_elems[9]);
      auVar52[10] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                      [10] == (puVar6->super_base_blob<256U>).m_data._M_elems[10]);
      auVar52[0xb] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                       [0xb] == (puVar6->super_base_blob<256U>).m_data._M_elems[0xb]);
      auVar52[0xc] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                       [0xc] == (puVar6->super_base_blob<256U>).m_data._M_elems[0xc]);
      auVar52[0xd] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                       [0xd] == (puVar6->super_base_blob<256U>).m_data._M_elems[0xd]);
      auVar52[0xe] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                       [0xe] == (puVar6->super_base_blob<256U>).m_data._M_elems[0xe]);
      auVar52[0xf] = -((consensusParams->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems
                       [0xf] == (puVar6->super_base_blob<256U>).m_data._M_elems[0xf]);
      auVar52 = auVar52 & auVar54;
      if ((ushort)((ushort)(SUB161(auVar52 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar52 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar52[0xf] >> 7) << 0xf) == 0xffff) goto LAB_00402644;
    }
LAB_004026ac:
    psVar32 = (block->vtx).
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar12 = (block->vtx).
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    bVar19 = psVar32 == psVar12;
    uVar22 = (uint)psVar12;
    if (!bVar19) {
      do {
        peVar13 = (psVar32->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr;
        bVar43 = (peVar13->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_finish !=
                 (peVar13->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (bVar43) {
          peVar13 = (psVar32->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr;
          log_msg._0_16_ =
               *(undefined1 (*) [16])(peVar13->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
          ;
          log_msg.field_2._M_allocated_capacity =
               *(undefined8 *)
                ((peVar13->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
          log_msg.field_2._8_8_ =
               *(undefined8 *)
                ((peVar13->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
          local_148._M_dataplus._M_p = local_148._M_dataplus._M_p & 0xffffffff00000000;
          iVar21 = (*(view->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[1])
                             (view,&log_msg);
          if ((char)iVar21 == '\0') {
            uVar23 = 1;
            do {
              peVar13 = (psVar32->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr;
              bVar43 = uVar23 < (ulong)(((long)(peVar13->vout).
                                               super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                               _M_impl.super__Vector_impl_data._M_finish -
                                         (long)(peVar13->vout).
                                               super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                               _M_impl.super__Vector_impl_data._M_start >> 3) *
                                       -0x3333333333333333);
              if (!bVar43) goto LAB_00402886;
              peVar13 = (psVar32->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr;
              log_msg._0_16_ =
                   *(undefined1 (*) [16])
                    (peVar13->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
              log_msg.field_2._M_allocated_capacity =
                   *(undefined8 *)
                    ((peVar13->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
              log_msg.field_2._8_8_ =
                   *(undefined8 *)
                    ((peVar13->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
              local_148._M_dataplus._M_p._0_4_ = (int)uVar23;
              iVar21 = (*(view->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[1])
                                 (view,&log_msg);
              uVar23 = uVar23 + 1;
            } while ((char)iVar21 == '\0');
          }
          args_2 = (char *)0xffffffffffffffff;
          logging_function_00._M_str = "ConnectBlock";
          logging_function_00._M_len = 0xc;
          source_file_03._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
          ;
          source_file_03._M_len = 0x57;
          ::LogPrintf_<>(logging_function_00,source_file_03,0xa0e,ALL,Info,
                         "ERROR: ConnectBlock(): tried to overwrite transaction\n");
          log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&log_msg,"bad-txns-BIP30","");
          log_msg_1._M_dataplus._M_p = (pointer)&log_msg_1.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&log_msg_1,"");
          bVar20 = ValidationState<BlockValidationResult>::Invalid
                             (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                              &log_msg,&log_msg_1);
          uVar22 = (uint)CONCAT71(extraout_var,bVar20);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)log_msg_1._M_dataplus._M_p != &log_msg_1.field_2) {
            operator_delete(log_msg_1._M_dataplus._M_p,
                            CONCAT71(log_msg_1.field_2._M_allocated_capacity._1_7_,
                                     log_msg_1.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)log_msg._M_dataplus._M_p != &log_msg.field_2) {
            operator_delete(log_msg._M_dataplus._M_p,log_msg.field_2._M_allocated_capacity + 1);
          }
        }
LAB_00402886:
        if (bVar43) break;
        psVar32 = psVar32 + 1;
        bVar19 = psVar32 == psVar12;
      } while (!bVar19);
    }
    uVar23 = (ulong)uVar22;
    if (!bVar19) goto LAB_00403e51;
  }
  uVar56 = (uint)uVar23;
  iVar4 = pindex_local->nHeight;
  iVar21 = (((this->m_chainman->m_options).chainparams)->consensus).CSVHeight;
  uVar22 = GetBlockScriptFlags(pindex_local,this->m_chainman);
  lVar31 = std::chrono::_V2::steady_clock::now();
  pdVar3 = &this->m_chainman->time_forks;
  pdVar3->__r = pdVar3->__r + (lVar31 - lVar29);
  pLVar30 = LogInstance();
  pdVar55 = (double *)0x402923;
  bVar19 = BCLog::Logger::WillLogCategoryLevel(pLVar30,BENCH,Debug);
  if (bVar19) {
    log_msg._M_dataplus._M_p = (pointer)((double)(lVar31 - lVar29) / 1000000.0);
    dVar44 = (double)(this->m_chainman->time_forks).__r;
    log_msg_1._M_dataplus._M_p = (pointer)(dVar44 / 1000000000.0);
    blockReward = (CAmount)((dVar44 / 1000000.0) / (double)this->m_chainman->num_blocks_total);
    args_2 = "    - Fork checks: %.2fms [%.2fs (%.2fms/blk)]\n";
    logging_function_01._M_str = "ConnectBlock";
    logging_function_01._M_len = 0xc;
    source_file_04._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
    source_file_04._M_len = 0x57;
    LogPrintf_<double,double,double>
              (logging_function_01,source_file_04,0xa23,
               IPC|COINDB|PROXY|RAND|CMPCTBLOCK|ESTIMATEFEE|ZMQ|BENCH|MEMPOOL,(Level)&log_msg,
               (char *)&log_msg_1,(double *)&blockReward,pdVar55,
               (double *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  }
  blockundo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  blockundo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  blockundo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pqueueIn = &this->m_chainman->m_script_check_queue;
  if (cVar57 == '\0') {
    pqueueIn = (CCheckQueue<CScriptCheck> *)0x0;
  }
  if (ptVar7 == ptVar8) {
    pqueueIn = (CCheckQueue<CScriptCheck> *)0x0;
  }
  CCheckQueueControl<CScriptCheck>::CCheckQueueControl(&control,pqueueIn);
  std::vector<PrecomputedTransactionData,_std::allocator<PrecomputedTransactionData>_>::vector
            (&txsdata,(long)(block->vtx).
                            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(block->vtx).
                            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4,
             (allocator_type *)&log_msg);
  prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<CTxUndo,_std::allocator<CTxUndo>_>::reserve
            (&blockundo.vtxundo,
             ((long)(block->vtx).
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(block->vtx).
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) - 1);
  psVar32 = (block->vtx).
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  bVar43 = (block->vtx).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish == psVar32;
  bVar19 = !bVar43;
  if (bVar43) {
    local_268 = 0;
    iVar40 = 0;
  }
  else {
    pvChecks = (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)0x0;
    if (ptVar7 != ptVar8) {
      pvChecks = &vChecks;
    }
    iVar40 = 0;
    local_280 = 0;
    uVar23 = 0;
    local_268 = 0;
    do {
      paVar39 = &log_msg_1.field_2;
      this_00 = psVar32[uVar23].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      pCVar14 = (this_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pCVar15 = (this_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar43 = CTransaction::IsCoinBase(this_00);
      if (bVar43) {
LAB_00402f54:
        iVar28 = GetTransactionSigOpCost(this_00,view,uVar22);
        local_280 = local_280 + iVar28;
        if (local_280 < 0x13881) {
          bVar43 = CTransaction::IsCoinBase(this_00);
          if (!bVar43) {
            vChecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            vChecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            vChecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            auVar17._8_8_ = 0;
            auVar17._0_8_ = (undefined1 *)((long)&log_msg.field_2 + 8);
            log_msg._0_16_ = auVar17 << 0x40;
            log_msg.field_2._M_allocated_capacity = 0;
            log_msg.field_2._8_8_ = log_msg.field_2._8_8_ & 0xffffffffffffff00;
            local_148._M_string_length = (size_type)(local_148.field_2._M_local_buf + 8);
            local_148.field_2._M_allocated_capacity = 0;
            local_148.field_2._M_local_buf[8] = '\0';
            if (cVar57 == '\0') {
LAB_00403137:
              bVar43 = true;
              if (control.pqueue != (CCheckQueue<CScriptCheck> *)0x0) {
                CCheckQueue<CScriptCheck>::Add(control.pqueue,&vChecks);
              }
            }
            else {
              args_2 = (char *)(ulong)fJustCheck;
              bVar43 = CheckInputScripts(this_00,(TxValidationState *)&log_msg,view,uVar22,
                                         fJustCheck,fJustCheck,
                                         txsdata.
                                         super__Vector_base<PrecomputedTransactionData,_std::allocator<PrecomputedTransactionData>_>
                                         ._M_impl.super__Vector_impl_data._M_start + uVar23,
                                         &this->m_chainman->m_validation_cache,pvChecks);
              if (bVar43) goto LAB_00403137;
              paVar39 = &log_msg_1.field_2;
              log_msg_1._M_dataplus._M_p = (pointer)paVar39;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&log_msg_1,log_msg._M_string_length,
                         log_msg.field_2._M_allocated_capacity + log_msg._M_string_length);
              blockReward = (CAmount)&local_68;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&blockReward,local_148._M_string_length,
                         (char *)(local_148._M_string_length +
                                 local_148.field_2._M_allocated_capacity));
              ValidationState<BlockValidationResult>::Invalid
                        (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                         &log_msg_1,(string *)&blockReward);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)blockReward != &local_68) {
                operator_delete((void *)blockReward,local_68._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)log_msg_1._M_dataplus._M_p != paVar39) {
                operator_delete(log_msg_1._M_dataplus._M_p,
                                CONCAT71(log_msg_1.field_2._M_allocated_capacity._1_7_,
                                         log_msg_1.field_2._M_local_buf[0]) + 1);
              }
              base_blob<256u>::ToString_abi_cxx11_(&log_msg_1,&this_00->hash);
              ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                        ((string *)&blockReward,&state->super_ValidationState<BlockValidationResult>
                        );
              args_2 = (char *)0xffffffffffffffff;
              logging_function_05._M_str = "ConnectBlock";
              logging_function_05._M_len = 0xc;
              source_file_08._M_str =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
              ;
              source_file_08._M_len = 0x57;
              ::LogPrintf_<std::__cxx11::string,std::__cxx11::string>
                        (logging_function_05,source_file_08,0xa6d,ALL,Error,
                         "ConnectBlock(): CheckInputScripts on %s failed with %s\n",&log_msg_1,
                         (string *)&blockReward);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)blockReward != &local_68) {
                operator_delete((void *)blockReward,local_68._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)log_msg_1._M_dataplus._M_p != paVar39) {
                operator_delete(log_msg_1._M_dataplus._M_p,
                                CONCAT71(log_msg_1.field_2._M_allocated_capacity._1_7_,
                                         log_msg_1.field_2._M_local_buf[0]) + 1);
              }
              bVar43 = false;
              uVar56 = 0;
            }
            if ((char *)local_148._M_string_length != (char *)((long)&local_148.field_2 + 8)) {
              operator_delete((void *)local_148._M_string_length,
                              CONCAT71(local_148.field_2._9_7_,local_148.field_2._M_local_buf[8]) +
                              1);
            }
            if ((undefined1 *)log_msg._M_string_length != (undefined1 *)((long)&log_msg.field_2 + 8)
               ) {
              operator_delete((void *)log_msg._M_string_length,log_msg.field_2._8_8_ + 1);
            }
            std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::~vector(&vChecks);
            if (!bVar43) goto LAB_00403383;
          }
          log_msg._M_dataplus._M_p = (pointer)0x0;
          log_msg._M_string_length = 0;
          log_msg.field_2._M_allocated_capacity = 0;
          txundo = &log_msg;
          if ((int)uVar23 != 0) {
            if (blockundo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                blockundo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<CTxUndo,_std::allocator<CTxUndo>_>::_M_realloc_insert<>
                        (&blockundo.vtxundo,
                         (iterator)
                         blockundo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
            }
            else {
              ((blockundo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
                super__Vector_impl_data._M_finish)->vprevout).
              super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)0x0;
              ((blockundo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
                super__Vector_impl_data._M_finish)->vprevout).
              super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.super__Vector_impl_data.
              _M_finish = (pointer)0x0;
              ((blockundo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
                super__Vector_impl_data._M_finish)->vprevout).
              super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage = (pointer)0x0;
              blockundo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   blockundo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            txundo = (string *)
                     (blockundo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>.
                      _M_impl.super__Vector_impl_data._M_finish + -1);
          }
          UpdateCoins(this_00,view,(CTxUndo *)txundo,pindex_local->nHeight);
          std::vector<Coin,_std::allocator<Coin>_>::~vector
                    ((vector<Coin,_std::allocator<Coin>_> *)&log_msg);
          bVar43 = true;
        }
        else {
          args_2 = (char *)0xffffffffffffffff;
          logging_function_04._M_str = "ConnectBlock";
          logging_function_04._M_len = 0xc;
          source_file_07._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
          ;
          source_file_07._M_len = 0x57;
          ::LogPrintf_<>(logging_function_04,source_file_07,0xa5f,ALL,Info,
                         "ERROR: ConnectBlock(): too many sigops\n");
          log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&log_msg,"bad-blk-sigops","");
          log_msg_1._M_dataplus._M_p = (pointer)&log_msg_1.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&log_msg_1,"");
          bVar43 = ValidationState<BlockValidationResult>::Invalid
                             (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                              &log_msg,&log_msg_1);
          uVar56 = (uint)CONCAT71(extraout_var_02,bVar43);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)log_msg_1._M_dataplus._M_p != &log_msg_1.field_2) {
            operator_delete(log_msg_1._M_dataplus._M_p,
                            CONCAT71(log_msg_1.field_2._M_allocated_capacity._1_7_,
                                     log_msg_1.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)log_msg._M_dataplus._M_p != &log_msg.field_2) {
            operator_delete(log_msg._M_dataplus._M_p,log_msg.field_2._M_allocated_capacity + 1);
          }
          bVar43 = false;
        }
      }
      else {
        txfee = 0;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = (undefined1 *)((long)&log_msg.field_2 + 8);
        log_msg._0_16_ = auVar16 << 0x40;
        log_msg.field_2._M_allocated_capacity = 0;
        log_msg.field_2._8_8_ = log_msg.field_2._8_8_ & 0xffffffffffffff00;
        local_148._M_string_length = (size_type)(local_148.field_2._M_local_buf + 8);
        local_148.field_2._M_allocated_capacity = 0;
        local_148.field_2._M_local_buf[8] = '\0';
        bVar43 = Consensus::CheckTxInputs
                           (this_00,(TxValidationState *)&log_msg,view,pindex_local->nHeight,&txfee)
        ;
        if (bVar43) {
          local_268 = local_268 + txfee;
          if (local_268 < 0x775f05a074001) {
            std::vector<int,_std::allocator<int>_>::resize
                      (&prevheights,
                       ((long)(this_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5);
            pCVar41 = (this_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if ((this_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish != pCVar41) {
              lVar29 = 0;
              uVar42 = 0;
              do {
                pCVar33 = CCoinsViewCache::AccessCoin
                                    (view,(COutPoint *)
                                          ((pCVar41->prevout).hash.m_wrapped.super_base_blob<256U>.
                                           m_data._M_elems + lVar29));
                prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar42] = *(uint *)&pCVar33->field_0x28 >> 1;
                uVar42 = uVar42 + 1;
                pCVar41 = (this_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start;
                lVar29 = lVar29 + 0x68;
              } while (uVar42 < (ulong)(((long)(this_00->vin).
                                               super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                               _M_impl.super__Vector_impl_data._M_finish -
                                         (long)pCVar41 >> 3) * 0x4ec4ec4ec4ec4ec5));
            }
            bVar20 = SequenceLocks(this_00,(uint)(iVar21 <= iVar4),&prevheights,pindex_local);
            bVar43 = true;
            if (bVar20) goto LAB_00402ef9;
            args_2 = "ERROR: %s: contains a non-BIP68-final transaction\n";
            logging_function_02._M_str = "ConnectBlock";
            logging_function_02._M_len = 0xc;
            source_file_05._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
            ;
            source_file_05._M_len = 0x57;
            LogPrintf_<char[13]>
                      (logging_function_02,source_file_05,0xa54,
                       IPC|COINDB|PROXY|RAND|CMPCTBLOCK|ESTIMATEFEE|RPC|WALLETDB|ZMQ|MEMPOOL|NET,
                       in_stack_fffffffffffffd48,(char *)CONCAT44(in_stack_fffffffffffffd54,uVar56),
                       (char (*) [13])CONCAT17(cVar57,in_stack_fffffffffffffd58));
            log_msg_1._M_dataplus._M_p = (pointer)&log_msg_1.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&log_msg_1,"bad-txns-nonfinal","");
            blockReward = (CAmount)&local_68;
            std::__cxx11::string::_M_construct<char_const*>((string *)&blockReward,"");
            bVar43 = ValidationState<BlockValidationResult>::Invalid
                               (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS
                                ,&log_msg_1,(string *)&blockReward);
            uVar56 = (uint)CONCAT71(extraout_var_00,bVar43);
          }
          else {
            args_2 = "ERROR: %s: accumulated fee in the block out of range.\n";
            logging_function_03._M_str = "ConnectBlock";
            logging_function_03._M_len = 0xc;
            source_file_06._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
            ;
            source_file_06._M_len = 0x57;
            LogPrintf_<char[13]>
                      (logging_function_03,source_file_06,0xa47,
                       IPC|COINDB|PROXY|RAND|CMPCTBLOCK|ESTIMATEFEE|RPC|HTTP|TOR,
                       in_stack_fffffffffffffd48,(char *)CONCAT44(in_stack_fffffffffffffd54,uVar56),
                       (char (*) [13])CONCAT17(cVar57,in_stack_fffffffffffffd58));
            log_msg_1._M_dataplus._M_p = (pointer)paVar39;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&log_msg_1,"bad-txns-accumulated-fee-outofrange","");
            blockReward = (CAmount)&local_68;
            std::__cxx11::string::_M_construct<char_const*>((string *)&blockReward,"");
            bVar43 = ValidationState<BlockValidationResult>::Invalid
                               (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS
                                ,&log_msg_1,(string *)&blockReward);
            uVar56 = (uint)CONCAT71(extraout_var_01,bVar43);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)blockReward != &local_68) {
            operator_delete((void *)blockReward,local_68._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)log_msg_1._M_dataplus._M_p != &log_msg_1.field_2) {
            operator_delete(log_msg_1._M_dataplus._M_p,
                            CONCAT71(log_msg_1.field_2._M_allocated_capacity._1_7_,
                                     log_msg_1.field_2._M_local_buf[0]) + 1);
          }
          bVar43 = false;
        }
        else {
          log_msg_1._M_dataplus._M_p = (pointer)paVar39;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&log_msg_1,log_msg._M_string_length,
                     log_msg.field_2._M_allocated_capacity + log_msg._M_string_length);
          blockReward = (CAmount)&local_68;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&blockReward,local_148._M_string_length,
                     (char *)(local_148._M_string_length + local_148.field_2._M_allocated_capacity))
          ;
          ValidationState<BlockValidationResult>::Invalid
                    (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,&log_msg_1
                     ,(string *)&blockReward);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)blockReward != &local_68) {
            operator_delete((void *)blockReward,local_68._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)log_msg_1._M_dataplus._M_p != paVar39) {
            operator_delete(log_msg_1._M_dataplus._M_p,
                            CONCAT71(log_msg_1.field_2._M_allocated_capacity._1_7_,
                                     log_msg_1.field_2._M_local_buf[0]) + 1);
          }
          base_blob<256u>::ToString_abi_cxx11_(&local_188,&this_00->hash);
          ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                    (&local_1a8,&state->super_ValidationState<BlockValidationResult>);
          pLVar30 = LogInstance();
          bVar43 = BCLog::Logger::Enabled(pLVar30);
          if (bVar43) {
            log_msg_1._M_string_length = 0;
            log_msg_1.field_2._M_local_buf[0] = '\0';
            log_msg_1._M_dataplus._M_p = (pointer)paVar39;
            tinyformat::format<char[13],std::__cxx11::string,std::__cxx11::string>
                      ((string *)&blockReward,(tinyformat *)"%s: Consensus::CheckTxInputs: %s, %s\n"
                       ,"ConnectBlock",(char (*) [13])&local_188,&local_1a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_2);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&log_msg_1,(string *)&blockReward);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)blockReward != &local_68) {
              operator_delete((void *)blockReward,local_68._M_allocated_capacity + 1);
            }
            pLVar30 = LogInstance();
            blockReward = 0x57;
            pcStack_70 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
            ;
            args_2 = (char *)0xa42;
            source_file._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
            ;
            source_file._M_len = 0x57;
            str._M_str = log_msg_1._M_dataplus._M_p;
            str._M_len = log_msg_1._M_string_length;
            logging_function_11._M_str = "ConnectBlock";
            logging_function_11._M_len = 0xc;
            BCLog::Logger::LogPrintStr(pLVar30,str,logging_function_11,source_file,0xa42,ALL,Error);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)log_msg_1._M_dataplus._M_p != paVar39) {
              operator_delete(log_msg_1._M_dataplus._M_p,
                              CONCAT71(log_msg_1.field_2._M_allocated_capacity._1_7_,
                                       log_msg_1.field_2._M_local_buf[0]) + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          bVar43 = false;
          uVar56 = 0;
        }
LAB_00402ef9:
        if ((char *)local_148._M_string_length != (char *)((long)&local_148.field_2 + 8)) {
          operator_delete((void *)local_148._M_string_length,
                          CONCAT71(local_148.field_2._9_7_,local_148.field_2._M_local_buf[8]) + 1);
        }
        if ((undefined1 *)log_msg._M_string_length != (undefined1 *)((long)&log_msg.field_2 + 8)) {
          operator_delete((void *)log_msg._M_string_length,log_msg.field_2._8_8_ + 1);
        }
        if (bVar43) goto LAB_00402f54;
LAB_00403383:
        bVar43 = false;
      }
      iVar40 = iVar40 + (int)((ulong)((long)pCVar14 - (long)pCVar15) >> 3) * -0x3b13b13b;
      if (!bVar43) break;
      uVar23 = (ulong)((int)uVar23 + 1);
      psVar32 = (block->vtx).
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar42 = (long)(block->vtx).
                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar32 >> 4;
      bVar19 = uVar23 < uVar42;
    } while (uVar23 < uVar42);
  }
  uVar23 = (ulong)uVar56;
  if (!bVar19) {
    lVar29 = std::chrono::_V2::steady_clock::now();
    pdVar3 = &this->m_chainman->time_connect;
    pdVar3->__r = pdVar3->__r + (lVar29 - lVar31);
    pLVar30 = LogInstance();
    bVar19 = BCLog::Logger::WillLogCategoryLevel(pLVar30,BENCH,Debug);
    if (bVar19) {
      lVar34 = (long)(block->vtx).
                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(block->vtx).
                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      lVar35 = lVar34 >> 4;
      local_224 = (undefined4)lVar35;
      local_d8._M_dataplus._M_p = (pointer)((double)(lVar29 - lVar31) / 1000000.0);
      auVar53._8_4_ = (int)(lVar34 >> 0x24);
      auVar53._0_8_ = lVar35;
      auVar53._12_4_ = 0x45300000;
      local_188._M_dataplus._M_p =
           (pointer)((double)local_d8._M_dataplus._M_p /
                    ((auVar53._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,local_224) - 4503599627370496.0)));
      local_1a8._M_dataplus._M_p = (pointer)0x0;
      if (1 < iVar40) {
        local_1a8._M_dataplus._M_p =
             (pointer)((double)local_d8._M_dataplus._M_p / (double)(iVar40 + -1));
      }
      dVar44 = (double)(this->m_chainman->time_connect).__r;
      txfee = (CAmount)(dVar44 / 1000000000.0);
      local_230 = (dVar44 / 1000000.0) / (double)this->m_chainman->num_blocks_total;
      pLVar30 = LogInstance();
      bVar19 = BCLog::Logger::Enabled(pLVar30);
      if (bVar19) {
        log_msg._M_string_length = 0;
        log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
        log_msg.field_2._M_allocated_capacity =
             log_msg.field_2._M_allocated_capacity & 0xffffffffffffff00;
        tinyformat::format<unsigned_int,double,double,double,double,double>
                  (&log_msg_1,
                   (tinyformat *)
                   "      - Connect %u transactions: %.2fms (%.3fms/tx, %.3fms/txin) [%.2fs (%.2fms/blk)]\n"
                   ,(char *)&local_224,(uint *)&local_d8,(double *)&local_188,(double *)&local_1a8,
                   (double *)&txfee,&local_230,
                   (double *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&log_msg,&log_msg_1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)log_msg_1._M_dataplus._M_p != &log_msg_1.field_2) {
          operator_delete(log_msg_1._M_dataplus._M_p,
                          CONCAT71(log_msg_1.field_2._M_allocated_capacity._1_7_,
                                   log_msg_1.field_2._M_local_buf[0]) + 1);
        }
        pLVar30 = LogInstance();
        log_msg_1._M_dataplus._M_p = (pointer)0x57;
        log_msg_1._M_string_length = (size_type)anon_var_dwarf_128d5d9;
        source_file_01._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
        ;
        source_file_01._M_len = 0x57;
        str_01._M_str = log_msg._M_dataplus._M_p;
        str_01._M_len = log_msg._M_string_length;
        logging_function_13._M_str = "ConnectBlock";
        logging_function_13._M_len = 0xc;
        BCLog::Logger::LogPrintStr
                  (pLVar30,str_01,logging_function_13,source_file_01,0xa7f,BENCH,Debug);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)log_msg._M_dataplus._M_p != &log_msg.field_2) {
          operator_delete(log_msg._M_dataplus._M_p,log_msg.field_2._M_allocated_capacity + 1);
        }
      }
    }
    lVar29 = (long)pindex_local->nHeight /
             (long)(consensusParams->consensus).nSubsidyHalvingInterval;
    uVar23 = 0;
    if ((int)lVar29 < 0x40) {
      uVar23 = 5000000000 >> ((byte)lVar29 & 0x3f);
    }
    blockReward = uVar23 + local_268;
    CVar36 = CTransaction::GetValueOut
                       ((((block->vtx).
                          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    if (blockReward < CVar36) {
      pcVar37 = (pointer)CTransaction::GetValueOut
                                   ((((block->vtx).
                                      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr);
      logging_function_06._M_str = "ConnectBlock";
      logging_function_06._M_len = 0xc;
      source_file_09._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
      ;
      source_file_09._M_len = 0x57;
      log_msg._M_dataplus._M_p = pcVar37;
      LogPrintf_<long,long>
                (logging_function_06,source_file_09,0xa83,
                 IPC|COINDB|PROXY|RAND|CMPCTBLOCK|ADDRMAN|RPC|WALLETDB|ZMQ|BENCH,(Level)&log_msg,
                 (char *)&blockReward,
                 (long *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                 (long *)CONCAT44(in_stack_fffffffffffffd54,uVar56));
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&log_msg,"bad-cb-amount","");
      log_msg_1._M_dataplus._M_p = (pointer)&log_msg_1.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&log_msg_1,"");
      bVar19 = ValidationState<BlockValidationResult>::Invalid
                         (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                          &log_msg,&log_msg_1);
LAB_00403dd1:
      uVar23 = (ulong)bVar19;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)log_msg_1._M_dataplus._M_p != &log_msg_1.field_2) {
        operator_delete(log_msg_1._M_dataplus._M_p,
                        CONCAT71(log_msg_1.field_2._M_allocated_capacity._1_7_,
                                 log_msg_1.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)log_msg._M_dataplus._M_p != &log_msg.field_2) {
        operator_delete(log_msg._M_dataplus._M_p,log_msg.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      if (control.pqueue != (CCheckQueue<CScriptCheck> *)0x0) {
        bVar19 = CCheckQueue<CScriptCheck>::Loop(control.pqueue,true);
        control.fDone = true;
        if (!bVar19) {
          logging_function_10._M_str = "ConnectBlock";
          logging_function_10._M_len = 0xc;
          source_file_13._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
          ;
          source_file_13._M_len = 0x57;
          LogPrintf_<char[13]>
                    (logging_function_10,source_file_13,0xa88,
                     IPC|COINDB|PROXY|RAND|CMPCTBLOCK|ADDRMAN|ESTIMATEFEE|WALLETDB|MEMPOOL|NET,
                     in_stack_fffffffffffffd48,(char *)CONCAT44(in_stack_fffffffffffffd54,uVar56),
                     (char (*) [13])CONCAT17(cVar57,in_stack_fffffffffffffd58));
          log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&log_msg,"block-validation-failed","");
          log_msg_1._M_dataplus._M_p = (pointer)&log_msg_1.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&log_msg_1,"");
          bVar19 = ValidationState<BlockValidationResult>::Invalid
                             (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                              &log_msg,&log_msg_1);
          goto LAB_00403dd1;
        }
      }
      lVar29 = std::chrono::_V2::steady_clock::now();
      pdVar3 = &this->m_chainman->time_verify;
      pdVar3->__r = pdVar3->__r + (lVar29 - lVar31);
      pLVar30 = LogInstance();
      pdVar55 = (double *)0x4039dc;
      bVar19 = BCLog::Logger::WillLogCategoryLevel(pLVar30,BENCH,Debug);
      if (bVar19) {
        local_d8._M_dataplus._M_p._0_4_ = iVar40 + -1;
        _Var48._M_p = (pointer)((double)(lVar29 - lVar31) / 1000000.0);
        log_msg._M_dataplus._M_p = _Var48._M_p;
        log_msg_1._M_dataplus._M_p = (pointer)0x0;
        if (1 < iVar40) {
          log_msg_1._M_dataplus._M_p = (pointer)((double)_Var48._M_p / (double)(iVar40 + -1));
        }
        dVar44 = (double)(this->m_chainman->time_verify).__r;
        vChecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)(dVar44 / 1000000000.0);
        local_b8[0] = (dVar44 / 1000000.0) / (double)this->m_chainman->num_blocks_total;
        logging_function_07._M_str = "ConnectBlock";
        logging_function_07._M_len = 0xc;
        source_file_10._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
        ;
        source_file_10._M_len = 0x57;
        LogPrintf_<int,double,double,double,double>
                  (logging_function_07,source_file_10,(int)&local_d8,(LogFlags)&log_msg,
                   (Level)&log_msg_1,(char *)&vChecks,(int *)local_b8,pdVar55,
                   (double *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                   (double *)CONCAT44(in_stack_fffffffffffffd54,uVar56),
                   (double *)CONCAT17(cVar57,in_stack_fffffffffffffd58));
      }
      uVar23 = 1;
      if (!fJustCheck) {
        bVar19 = ::node::BlockManager::WriteUndoDataForBlock
                           (this->m_blockman,&blockundo,state,pindex_local);
        if (bVar19) {
          lVar31 = std::chrono::_V2::steady_clock::now();
          pdVar3 = &this->m_chainman->time_undo;
          pdVar3->__r = pdVar3->__r + (lVar31 - lVar29);
          pLVar30 = LogInstance();
          pdVar55 = (double *)0x403b27;
          bVar19 = BCLog::Logger::WillLogCategoryLevel(pLVar30,BENCH,Debug);
          if (bVar19) {
            log_msg._M_dataplus._M_p = (pointer)((double)(lVar31 - lVar29) / 1000000.0);
            dVar44 = (double)(this->m_chainman->time_undo).__r;
            log_msg_1._M_dataplus._M_p = (pointer)(dVar44 / 1000000000.0);
            vChecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)((dVar44 / 1000000.0) / (double)this->m_chainman->num_blocks_total);
            logging_function_08._M_str = "ConnectBlock";
            logging_function_08._M_len = 0xc;
            source_file_11._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
            ;
            source_file_11._M_len = 0x57;
            LogPrintf_<double,double,double>
                      (logging_function_08,source_file_11,0xa9f,
                       IPC|COINDB|PROXY|RAND|CMPCTBLOCK|ADDRMAN|ESTIMATEFEE|RPC|ZMQ|BENCH|HTTP|
                       MEMPOOL|NET,(Level)&log_msg,(char *)&log_msg_1,(double *)&vChecks,pdVar55,
                       (double *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
          }
          uVar22 = pindex_local->nStatus;
          if ((uVar22 & 0x60) != 0 || (uVar22 & 7) < 5) {
            if ((uVar22 & 7) < 5 && (uVar22 & 0x60) == 0) {
              pindex_local->nStatus = uVar22 & 0xffffff98 | 5;
            }
            std::
            _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
            ::_M_insert_unique<CBlockIndex*const&>
                      ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
                        *)&this->m_blockman->m_dirty_blockindex,&pindex_local);
          }
          puVar6 = pindex_local->phashBlock;
          if (puVar6 == (uint256 *)0x0) {
LAB_00404143:
            __assert_fail("phashBlock != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                          ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
          }
          log_msg._0_16_ = *(undefined1 (*) [16])(puVar6->super_base_blob<256U>).m_data._M_elems;
          log_msg.field_2._M_allocated_capacity =
               *(undefined8 *)((puVar6->super_base_blob<256U>).m_data._M_elems + 0x10);
          log_msg.field_2._8_8_ =
               *(undefined8 *)((puVar6->super_base_blob<256U>).m_data._M_elems + 0x18);
          CCoinsViewCache::SetBestBlock(view,(uint256 *)&log_msg);
          lVar29 = std::chrono::_V2::steady_clock::now();
          pdVar3 = &this->m_chainman->time_index;
          pdVar3->__r = pdVar3->__r + (lVar29 - lVar31);
          pLVar30 = LogInstance();
          pdVar55 = (double *)0x403c90;
          bVar19 = BCLog::Logger::WillLogCategoryLevel(pLVar30,BENCH,Debug);
          if (bVar19) {
            log_msg._M_dataplus._M_p = (pointer)((double)(lVar29 - lVar31) / 1000000.0);
            dVar44 = (double)(this->m_chainman->time_index).__r;
            log_msg_1._M_dataplus._M_p = (pointer)(dVar44 / 1000000000.0);
            vChecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)((dVar44 / 1000000.0) / (double)this->m_chainman->num_blocks_total);
            logging_function_09._M_str = "ConnectBlock";
            logging_function_09._M_len = 0xc;
            source_file_12._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
            ;
            source_file_12._M_len = 0x57;
            LogPrintf_<double,double,double>
                      (logging_function_09,source_file_12,0xaae,
                       IPC|COINDB|PROXY|RAND|CMPCTBLOCK|ADDRMAN|ESTIMATEFEE|RPC|WALLETDB|ZMQ|BENCH|
                       NET,(Level)&log_msg,(char *)&log_msg_1,(double *)&vChecks,pdVar55,
                       (double *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
          }
        }
        else {
          uVar23 = 0;
        }
      }
    }
  }
  if (prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<PrecomputedTransactionData,_std::allocator<PrecomputedTransactionData>_>::~vector
            (&txsdata);
  CCheckQueueControl<CScriptCheck>::~CCheckQueueControl(&control);
  std::vector<CTxUndo,_std::allocator<CTxUndo>_>::~vector(&blockundo.vtxundo);
LAB_00403e51:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar5) {
    __stack_chk_fail();
  }
  return (bool)((byte)uVar23 & 1);
}

Assistant:

bool Chainstate::ConnectBlock(const CBlock& block, BlockValidationState& state, CBlockIndex* pindex,
                               CCoinsViewCache& view, bool fJustCheck)
{
    AssertLockHeld(cs_main);
    assert(pindex);

    uint256 block_hash{block.GetHash()};
    assert(*pindex->phashBlock == block_hash);
    const bool parallel_script_checks{m_chainman.GetCheckQueue().HasThreads()};

    const auto time_start{SteadyClock::now()};
    const CChainParams& params{m_chainman.GetParams()};

    // Check it again in case a previous version let a bad block in
    // NOTE: We don't currently (re-)invoke ContextualCheckBlock() or
    // ContextualCheckBlockHeader() here. This means that if we add a new
    // consensus rule that is enforced in one of those two functions, then we
    // may have let in a block that violates the rule prior to updating the
    // software, and we would NOT be enforcing the rule here. Fully solving
    // upgrade from one software version to the next after a consensus rule
    // change is potentially tricky and issue-specific (see NeedsRedownload()
    // for one approach that was used for BIP 141 deployment).
    // Also, currently the rule against blocks more than 2 hours in the future
    // is enforced in ContextualCheckBlockHeader(); we wouldn't want to
    // re-enforce that rule here (at least until we make it impossible for
    // the clock to go backward).
    if (!CheckBlock(block, state, params.GetConsensus(), !fJustCheck, !fJustCheck)) {
        if (state.GetResult() == BlockValidationResult::BLOCK_MUTATED) {
            // We don't write down blocks to disk if they may have been
            // corrupted, so this should be impossible unless we're having hardware
            // problems.
            return FatalError(m_chainman.GetNotifications(), state, _("Corrupt block found indicating potential hardware failure."));
        }
        LogError("%s: Consensus::CheckBlock: %s\n", __func__, state.ToString());
        return false;
    }

    // verify that the view's current state corresponds to the previous block
    uint256 hashPrevBlock = pindex->pprev == nullptr ? uint256() : pindex->pprev->GetBlockHash();
    assert(hashPrevBlock == view.GetBestBlock());

    m_chainman.num_blocks_total++;

    // Special case for the genesis block, skipping connection of its transactions
    // (its coinbase is unspendable)
    if (block_hash == params.GetConsensus().hashGenesisBlock) {
        if (!fJustCheck)
            view.SetBestBlock(pindex->GetBlockHash());
        return true;
    }

    bool fScriptChecks = true;
    if (!m_chainman.AssumedValidBlock().IsNull()) {
        // We've been configured with the hash of a block which has been externally verified to have a valid history.
        // A suitable default value is included with the software and updated from time to time.  Because validity
        //  relative to a piece of software is an objective fact these defaults can be easily reviewed.
        // This setting doesn't force the selection of any particular chain but makes validating some faster by
        //  effectively caching the result of part of the verification.
        BlockMap::const_iterator it{m_blockman.m_block_index.find(m_chainman.AssumedValidBlock())};
        if (it != m_blockman.m_block_index.end()) {
            if (it->second.GetAncestor(pindex->nHeight) == pindex &&
                m_chainman.m_best_header->GetAncestor(pindex->nHeight) == pindex &&
                m_chainman.m_best_header->nChainWork >= m_chainman.MinimumChainWork()) {
                // This block is a member of the assumed verified chain and an ancestor of the best header.
                // Script verification is skipped when connecting blocks under the
                // assumevalid block. Assuming the assumevalid block is valid this
                // is safe because block merkle hashes are still computed and checked,
                // Of course, if an assumed valid block is invalid due to false scriptSigs
                // this optimization would allow an invalid chain to be accepted.
                // The equivalent time check discourages hash power from extorting the network via DOS attack
                //  into accepting an invalid block through telling users they must manually set assumevalid.
                //  Requiring a software change or burying the invalid block, regardless of the setting, makes
                //  it hard to hide the implication of the demand.  This also avoids having release candidates
                //  that are hardly doing any signature verification at all in testing without having to
                //  artificially set the default assumed verified block further back.
                // The test against the minimum chain work prevents the skipping when denied access to any chain at
                //  least as good as the expected chain.
                fScriptChecks = (GetBlockProofEquivalentTime(*m_chainman.m_best_header, *pindex, *m_chainman.m_best_header, params.GetConsensus()) <= 60 * 60 * 24 * 7 * 2);
            }
        }
    }

    const auto time_1{SteadyClock::now()};
    m_chainman.time_check += time_1 - time_start;
    LogDebug(BCLog::BENCH, "    - Sanity checks: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_1 - time_start),
             Ticks<SecondsDouble>(m_chainman.time_check),
             Ticks<MillisecondsDouble>(m_chainman.time_check) / m_chainman.num_blocks_total);

    // Do not allow blocks that contain transactions which 'overwrite' older transactions,
    // unless those are already completely spent.
    // If such overwrites are allowed, coinbases and transactions depending upon those
    // can be duplicated to remove the ability to spend the first instance -- even after
    // being sent to another address.
    // See BIP30, CVE-2012-1909, and http://r6.ca/blog/20120206T005236Z.html for more information.
    // This rule was originally applied to all blocks with a timestamp after March 15, 2012, 0:00 UTC.
    // Now that the whole chain is irreversibly beyond that time it is applied to all blocks except the
    // two in the chain that violate it. This prevents exploiting the issue against nodes during their
    // initial block download.
    bool fEnforceBIP30 = !IsBIP30Repeat(*pindex);

    // Once BIP34 activated it was not possible to create new duplicate coinbases and thus other than starting
    // with the 2 existing duplicate coinbase pairs, not possible to create overwriting txs.  But by the
    // time BIP34 activated, in each of the existing pairs the duplicate coinbase had overwritten the first
    // before the first had been spent.  Since those coinbases are sufficiently buried it's no longer possible to create further
    // duplicate transactions descending from the known pairs either.
    // If we're on the known chain at height greater than where BIP34 activated, we can save the db accesses needed for the BIP30 check.

    // BIP34 requires that a block at height X (block X) has its coinbase
    // scriptSig start with a CScriptNum of X (indicated height X).  The above
    // logic of no longer requiring BIP30 once BIP34 activates is flawed in the
    // case that there is a block X before the BIP34 height of 227,931 which has
    // an indicated height Y where Y is greater than X.  The coinbase for block
    // X would also be a valid coinbase for block Y, which could be a BIP30
    // violation.  An exhaustive search of all mainnet coinbases before the
    // BIP34 height which have an indicated height greater than the block height
    // reveals many occurrences. The 3 lowest indicated heights found are
    // 209,921, 490,897, and 1,983,702 and thus coinbases for blocks at these 3
    // heights would be the first opportunity for BIP30 to be violated.

    // The search reveals a great many blocks which have an indicated height
    // greater than 1,983,702, so we simply remove the optimization to skip
    // BIP30 checking for blocks at height 1,983,702 or higher.  Before we reach
    // that block in another 25 years or so, we should take advantage of a
    // future consensus change to do a new and improved version of BIP34 that
    // will actually prevent ever creating any duplicate coinbases in the
    // future.
    static constexpr int BIP34_IMPLIES_BIP30_LIMIT = 1983702;

    // There is no potential to create a duplicate coinbase at block 209,921
    // because this is still before the BIP34 height and so explicit BIP30
    // checking is still active.

    // The final case is block 176,684 which has an indicated height of
    // 490,897. Unfortunately, this issue was not discovered until about 2 weeks
    // before block 490,897 so there was not much opportunity to address this
    // case other than to carefully analyze it and determine it would not be a
    // problem. Block 490,897 was, in fact, mined with a different coinbase than
    // block 176,684, but it is important to note that even if it hadn't been or
    // is remined on an alternate fork with a duplicate coinbase, we would still
    // not run into a BIP30 violation.  This is because the coinbase for 176,684
    // is spent in block 185,956 in transaction
    // d4f7fbbf92f4a3014a230b2dc70b8058d02eb36ac06b4a0736d9d60eaa9e8781.  This
    // spending transaction can't be duplicated because it also spends coinbase
    // 0328dd85c331237f18e781d692c92de57649529bd5edf1d01036daea32ffde29.  This
    // coinbase has an indicated height of over 4.2 billion, and wouldn't be
    // duplicatable until that height, and it's currently impossible to create a
    // chain that long. Nevertheless we may wish to consider a future soft fork
    // which retroactively prevents block 490,897 from creating a duplicate
    // coinbase. The two historical BIP30 violations often provide a confusing
    // edge case when manipulating the UTXO and it would be simpler not to have
    // another edge case to deal with.

    // testnet3 has no blocks before the BIP34 height with indicated heights
    // post BIP34 before approximately height 486,000,000. After block
    // 1,983,702 testnet3 starts doing unnecessary BIP30 checking again.
    assert(pindex->pprev);
    CBlockIndex* pindexBIP34height = pindex->pprev->GetAncestor(params.GetConsensus().BIP34Height);
    //Only continue to enforce if we're below BIP34 activation height or the block hash at that height doesn't correspond.
    fEnforceBIP30 = fEnforceBIP30 && (!pindexBIP34height || !(pindexBIP34height->GetBlockHash() == params.GetConsensus().BIP34Hash));

    // TODO: Remove BIP30 checking from block height 1,983,702 on, once we have a
    // consensus change that ensures coinbases at those heights cannot
    // duplicate earlier coinbases.
    if (fEnforceBIP30 || pindex->nHeight >= BIP34_IMPLIES_BIP30_LIMIT) {
        for (const auto& tx : block.vtx) {
            for (size_t o = 0; o < tx->vout.size(); o++) {
                if (view.HaveCoin(COutPoint(tx->GetHash(), o))) {
                    LogPrintf("ERROR: ConnectBlock(): tried to overwrite transaction\n");
                    return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-txns-BIP30");
                }
            }
        }
    }

    // Enforce BIP68 (sequence locks)
    int nLockTimeFlags = 0;
    if (DeploymentActiveAt(*pindex, m_chainman, Consensus::DEPLOYMENT_CSV)) {
        nLockTimeFlags |= LOCKTIME_VERIFY_SEQUENCE;
    }

    // Get the script flags for this block
    unsigned int flags{GetBlockScriptFlags(*pindex, m_chainman)};

    const auto time_2{SteadyClock::now()};
    m_chainman.time_forks += time_2 - time_1;
    LogDebug(BCLog::BENCH, "    - Fork checks: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_2 - time_1),
             Ticks<SecondsDouble>(m_chainman.time_forks),
             Ticks<MillisecondsDouble>(m_chainman.time_forks) / m_chainman.num_blocks_total);

    CBlockUndo blockundo;

    // Precomputed transaction data pointers must not be invalidated
    // until after `control` has run the script checks (potentially
    // in multiple threads). Preallocate the vector size so a new allocation
    // doesn't invalidate pointers into the vector, and keep txsdata in scope
    // for as long as `control`.
    CCheckQueueControl<CScriptCheck> control(fScriptChecks && parallel_script_checks ? &m_chainman.GetCheckQueue() : nullptr);
    std::vector<PrecomputedTransactionData> txsdata(block.vtx.size());

    std::vector<int> prevheights;
    CAmount nFees = 0;
    int nInputs = 0;
    int64_t nSigOpsCost = 0;
    blockundo.vtxundo.reserve(block.vtx.size() - 1);
    for (unsigned int i = 0; i < block.vtx.size(); i++)
    {
        const CTransaction &tx = *(block.vtx[i]);

        nInputs += tx.vin.size();

        if (!tx.IsCoinBase())
        {
            CAmount txfee = 0;
            TxValidationState tx_state;
            if (!Consensus::CheckTxInputs(tx, tx_state, view, pindex->nHeight, txfee)) {
                // Any transaction validation failure in ConnectBlock is a block consensus failure
                state.Invalid(BlockValidationResult::BLOCK_CONSENSUS,
                            tx_state.GetRejectReason(), tx_state.GetDebugMessage());
                LogError("%s: Consensus::CheckTxInputs: %s, %s\n", __func__, tx.GetHash().ToString(), state.ToString());
                return false;
            }
            nFees += txfee;
            if (!MoneyRange(nFees)) {
                LogPrintf("ERROR: %s: accumulated fee in the block out of range.\n", __func__);
                return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-txns-accumulated-fee-outofrange");
            }

            // Check that transaction is BIP68 final
            // BIP68 lock checks (as opposed to nLockTime checks) must
            // be in ConnectBlock because they require the UTXO set
            prevheights.resize(tx.vin.size());
            for (size_t j = 0; j < tx.vin.size(); j++) {
                prevheights[j] = view.AccessCoin(tx.vin[j].prevout).nHeight;
            }

            if (!SequenceLocks(tx, nLockTimeFlags, prevheights, *pindex)) {
                LogPrintf("ERROR: %s: contains a non-BIP68-final transaction\n", __func__);
                return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-txns-nonfinal");
            }
        }

        // GetTransactionSigOpCost counts 3 types of sigops:
        // * legacy (always)
        // * p2sh (when P2SH enabled in flags and excludes coinbase)
        // * witness (when witness enabled in flags and excludes coinbase)
        nSigOpsCost += GetTransactionSigOpCost(tx, view, flags);
        if (nSigOpsCost > MAX_BLOCK_SIGOPS_COST) {
            LogPrintf("ERROR: ConnectBlock(): too many sigops\n");
            return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-blk-sigops");
        }

        if (!tx.IsCoinBase())
        {
            std::vector<CScriptCheck> vChecks;
            bool fCacheResults = fJustCheck; /* Don't cache results if we're actually connecting blocks (still consult the cache, though) */
            TxValidationState tx_state;
            if (fScriptChecks && !CheckInputScripts(tx, tx_state, view, flags, fCacheResults, fCacheResults, txsdata[i], m_chainman.m_validation_cache, parallel_script_checks ? &vChecks : nullptr)) {
                // Any transaction validation failure in ConnectBlock is a block consensus failure
                state.Invalid(BlockValidationResult::BLOCK_CONSENSUS,
                              tx_state.GetRejectReason(), tx_state.GetDebugMessage());
                LogError("ConnectBlock(): CheckInputScripts on %s failed with %s\n",
                    tx.GetHash().ToString(), state.ToString());
                return false;
            }
            control.Add(std::move(vChecks));
        }

        CTxUndo undoDummy;
        if (i > 0) {
            blockundo.vtxundo.emplace_back();
        }
        UpdateCoins(tx, view, i == 0 ? undoDummy : blockundo.vtxundo.back(), pindex->nHeight);
    }
    const auto time_3{SteadyClock::now()};
    m_chainman.time_connect += time_3 - time_2;
    LogDebug(BCLog::BENCH, "      - Connect %u transactions: %.2fms (%.3fms/tx, %.3fms/txin) [%.2fs (%.2fms/blk)]\n", (unsigned)block.vtx.size(),
             Ticks<MillisecondsDouble>(time_3 - time_2), Ticks<MillisecondsDouble>(time_3 - time_2) / block.vtx.size(),
             nInputs <= 1 ? 0 : Ticks<MillisecondsDouble>(time_3 - time_2) / (nInputs - 1),
             Ticks<SecondsDouble>(m_chainman.time_connect),
             Ticks<MillisecondsDouble>(m_chainman.time_connect) / m_chainman.num_blocks_total);

    CAmount blockReward = nFees + GetBlockSubsidy(pindex->nHeight, params.GetConsensus());
    if (block.vtx[0]->GetValueOut() > blockReward) {
        LogPrintf("ERROR: ConnectBlock(): coinbase pays too much (actual=%d vs limit=%d)\n", block.vtx[0]->GetValueOut(), blockReward);
        return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-cb-amount");
    }

    if (!control.Wait()) {
        LogPrintf("ERROR: %s: CheckQueue failed\n", __func__);
        return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "block-validation-failed");
    }
    const auto time_4{SteadyClock::now()};
    m_chainman.time_verify += time_4 - time_2;
    LogDebug(BCLog::BENCH, "    - Verify %u txins: %.2fms (%.3fms/txin) [%.2fs (%.2fms/blk)]\n", nInputs - 1,
             Ticks<MillisecondsDouble>(time_4 - time_2),
             nInputs <= 1 ? 0 : Ticks<MillisecondsDouble>(time_4 - time_2) / (nInputs - 1),
             Ticks<SecondsDouble>(m_chainman.time_verify),
             Ticks<MillisecondsDouble>(m_chainman.time_verify) / m_chainman.num_blocks_total);

    if (fJustCheck)
        return true;

    if (!m_blockman.WriteUndoDataForBlock(blockundo, state, *pindex)) {
        return false;
    }

    const auto time_5{SteadyClock::now()};
    m_chainman.time_undo += time_5 - time_4;
    LogDebug(BCLog::BENCH, "    - Write undo data: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_5 - time_4),
             Ticks<SecondsDouble>(m_chainman.time_undo),
             Ticks<MillisecondsDouble>(m_chainman.time_undo) / m_chainman.num_blocks_total);

    if (!pindex->IsValid(BLOCK_VALID_SCRIPTS)) {
        pindex->RaiseValidity(BLOCK_VALID_SCRIPTS);
        m_blockman.m_dirty_blockindex.insert(pindex);
    }

    // add this block to the view's block chain
    view.SetBestBlock(pindex->GetBlockHash());

    const auto time_6{SteadyClock::now()};
    m_chainman.time_index += time_6 - time_5;
    LogDebug(BCLog::BENCH, "    - Index writing: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_6 - time_5),
             Ticks<SecondsDouble>(m_chainman.time_index),
             Ticks<MillisecondsDouble>(m_chainman.time_index) / m_chainman.num_blocks_total);

    TRACE6(validation, block_connected,
        block_hash.data(),
        pindex->nHeight,
        block.vtx.size(),
        nInputs,
        nSigOpsCost,
        time_5 - time_start // in microseconds (µs)
    );

    return true;
}